

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O3

BanMan * EnsureBanman(NodeContext *node)

{
  BanMan *pBVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar1 = (node->banman)._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
           super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
           super__Head_base<0UL,_BanMan_*,_false>._M_head_impl;
  if (pBVar1 == (BanMan *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Error: Ban database not loaded","");
    JSONRPCError(__return_storage_ptr__,-0x14,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pBVar1;
  }
  __stack_chk_fail();
}

Assistant:

BanMan& EnsureBanman(const NodeContext& node)
{
    if (!node.banman) {
        throw JSONRPCError(RPC_DATABASE_ERROR, "Error: Ban database not loaded");
    }
    return *node.banman;
}